

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::sectionEndedEarly(RunContext *this,SectionEndInfo *endInfo)

{
  pointer *pppIVar1;
  
  (*(this->m_activeSections).
    super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_ITracker
    [(ulong)((this->m_unfinishedSections).
             super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>.
             _M_impl.super__Vector_impl_data._M_start ==
            (this->m_unfinishedSections).
            super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) + 8])();
  pppIVar1 = &(this->m_activeSections).
              super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppIVar1 = *pppIVar1 + -1;
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::push_back
            (&this->m_unfinishedSections,endInfo);
  return;
}

Assistant:

void RunContext::sectionEndedEarly(SectionEndInfo const & endInfo) {
        if (m_unfinishedSections.empty())
            m_activeSections.back()->fail();
        else
            m_activeSections.back()->close();
        m_activeSections.pop_back();

        m_unfinishedSections.push_back(endInfo);
    }